

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_urldecode(char *string,char *escaped,int len)

{
  char cVar1;
  byte bVar2;
  byte local_2d;
  int iStack_28;
  char sum;
  int n;
  int state;
  int len_local;
  char *escaped_local;
  char *string_local;
  
  iStack_28 = 0;
  local_2d = 0;
  n = len;
  _state = escaped;
  escaped_local = string;
  while( true ) {
    do {
      while( true ) {
        while( true ) {
          if (*_state == '\0' || n == 0) {
            *escaped_local = '\0';
            return 0;
          }
          if (iStack_28 != 0) break;
          if (*_state == '%') {
            iStack_28 = 1;
            _state = _state + 1;
          }
          else if (*_state == '+') {
            *escaped_local = ' ';
            n = n + -1;
            _state = _state + 1;
            escaped_local = escaped_local + 1;
          }
          else {
            *escaped_local = *_state;
            n = n + -1;
            _state = _state + 1;
            escaped_local = escaped_local + 1;
          }
        }
        if (iStack_28 != 1) break;
        cVar1 = char_to_hex(*_state);
        if (cVar1 < 0) {
          return -1;
        }
        local_2d = (byte)((int)cVar1 << 4);
        iStack_28 = 2;
        _state = _state + 1;
      }
    } while (iStack_28 != 2);
    bVar2 = char_to_hex(*_state);
    if ((char)bVar2 < '\0') break;
    *escaped_local = local_2d | bVar2;
    n = n + -1;
    iStack_28 = 0;
    _state = _state + 1;
    escaped_local = escaped_local + 1;
  }
  return -1;
}

Assistant:

int
lws_urldecode(char *string, const char *escaped, int len)
{
	int state = 0, n;
	char sum = 0;

	while (*escaped && len) {
		switch (state) {
		case 0:
			if (*escaped == '%') {
				state++;
				escaped++;
				continue;
			}
			if (*escaped == '+') {
				escaped++;
				*string++ = ' ';
				len--;
				continue;
			}
			*string++ = *escaped++;
			len--;
			break;
		case 1:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			sum = (char)(n << 4);
			state++;
			break;

		case 2:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			*string++ = (char)(sum | n);
			len--;
			state = 0;
			break;
		}

	}
	*string = '\0';

	return 0;
}